

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_underflow.c
# Opt level: O0

int main(void)

{
  int iVar1;
  size_t sVar2;
  int local_24;
  int index;
  size_t length;
  char src [12];
  
  src[4] = '\0';
  src[5] = '\0';
  src[6] = '\0';
  src[7] = '\0';
  strncpy((char *)&length,"Hello World",0xc);
  sVar2 = strlen((char *)&length);
  local_24 = (int)sVar2;
  while (local_24 = local_24 + -1, src[(long)local_24 + -8] != ':') {
    src[(long)local_24 + -8] = '\0';
  }
  iVar1._0_1_ = src[4];
  iVar1._1_1_ = src[5];
  iVar1._2_1_ = src[6];
  iVar1._3_1_ = src[7];
  return iVar1;
}

Assistant:

int main() {
  char src[12];
  strncpy(src, "Hello World", sizeof(src));

  size_t length = strlen(src);

  int index = (length -1);
  while (src[index] != ':') {
    src[index] = '\0';
    index--;
  }
}